

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_hair.cpp
# Opt level: O2

void __thiscall
embree::sse2::BVHNHairBuilderSAH<4,_embree::CurveNi<4>,_embree::LineMi<4>,_embree::PointMi<4>_>::
build(BVHNHairBuilderSAH<4,_embree::CurveNi<4>,_embree::LineMi<4>,_embree::PointMi<4>_> *this)

{
  BVHNHairBuilderSAH<4,_embree::CurveNi<4>,_embree::LineMi<4>,_embree::PointMi<4>_> *pBVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  BVHN<4> *this_00;
  long lVar4;
  void *pvVar5;
  MemoryMonitorInterface *pMVar6;
  undefined8 uVar7;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  NodeRefPtr<4> root;
  size_t i;
  long lVar11;
  mvector<PrimRef> *prims;
  ulong numPrimRefs;
  ulong uVar12;
  Set local_114;
  Create local_113;
  Set local_112;
  Create local_111;
  mvector<PrimRef> *local_110;
  Settings *local_108;
  double local_100;
  PrimInfo pinfo;
  anon_class_8_1_8991fb9c reportFinishedRange;
  anon_class_8_1_8991fb9c createLeaf;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (*(long *)(this + 0x70) != -1) {
    FastAllocator::unshare((FastAllocator *)(*(long *)(this + 0x10) + 0x78),(int)this + 0x20);
  }
  this_00 = *(BVHN<4> **)(this + 0x10);
  lVar11 = *(long *)(this + 0x18);
  numPrimRefs = *(long *)(lVar11 + 0x2b0) + *(long *)(lVar11 + 0x2c0) + *(long *)(lVar11 + 0x340);
  if (numPrimRefs == 0) {
    (*(this_00->super_AccelData).super_RefCount._vptr_RefCount[5])(this_00);
    lVar11 = *(long *)(this + 0x38);
    pvVar5 = *(void **)(this + 0x40);
    if (pvVar5 != (void *)0x0) {
      if ((ulong)(lVar11 << 5) < 0x1c00000) {
        alignedFree(pvVar5);
      }
      else {
        os_free(pvVar5,lVar11 << 5,(bool)this[0x28]);
      }
    }
    if (lVar11 != 0) {
      (**(code **)**(undefined8 **)(this + 0x20))(*(undefined8 **)(this + 0x20),lVar11 * -0x20,1);
    }
    *(undefined8 *)(this + 0x30) = 0;
    *(undefined8 *)(this + 0x38) = 0;
    *(undefined8 *)(this + 0x40) = 0;
  }
  else {
    std::__cxx11::to_string((string *)&createLeaf,4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_78.field_1,"sse2::BVH",(string *)&createLeaf);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pinfo,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_78.field_1,"HairBuilderSAH");
    local_100 = BVHN<4>::preBuild(this_00,(string *)&pinfo);
    std::__cxx11::string::~string((string *)&pinfo);
    std::__cxx11::string::~string((string *)&local_78.field_1);
    std::__cxx11::string::~string((string *)&createLeaf);
    uVar9 = *(ulong *)(this + 0x38);
    uVar10 = uVar9;
    if ((uVar9 < numPrimRefs) && (uVar12 = uVar9, uVar10 = numPrimRefs, uVar9 != 0)) {
      for (; uVar10 = uVar12, uVar12 < numPrimRefs; uVar12 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0))
      {
      }
    }
    pBVar1 = this + 0x30;
    if (numPrimRefs < *(ulong *)(this + 0x30)) {
      *(ulong *)pBVar1 = numPrimRefs;
    }
    local_108 = (Settings *)(this + 0x48);
    prims = (mvector<PrimRef> *)(this + 0x20);
    if (uVar9 == uVar10) {
      *(ulong *)pBVar1 = numPrimRefs;
    }
    else {
      pvVar5 = *(void **)(this + 0x40);
      uVar9 = uVar10 << 5;
      local_110 = prims;
      (**(code **)**(undefined8 **)(this + 0x20))(*(undefined8 **)(this + 0x20),uVar9,0);
      if (uVar9 < 0x1c00000) {
        pvVar8 = alignedMalloc(uVar9,0x20);
      }
      else {
        pvVar8 = os_malloc(uVar9,(bool *)(this + 0x28));
      }
      *(void **)(this + 0x40) = pvVar8;
      lVar11 = 0x10;
      for (uVar9 = 0; uVar9 < *(ulong *)pBVar1; uVar9 = uVar9 + 1) {
        lVar4 = *(long *)(this + 0x40);
        puVar2 = (undefined8 *)((long)pvVar5 + lVar11 + -0x10);
        uVar7 = puVar2[1];
        puVar3 = (undefined8 *)(lVar4 + -0x10 + lVar11);
        *puVar3 = *puVar2;
        puVar3[1] = uVar7;
        uVar7 = ((undefined8 *)((long)pvVar5 + lVar11))[1];
        puVar2 = (undefined8 *)(lVar4 + lVar11);
        *puVar2 = *(undefined8 *)((long)pvVar5 + lVar11);
        puVar2[1] = uVar7;
        lVar11 = lVar11 + 0x20;
      }
      lVar11 = *(long *)(this + 0x38);
      if (pvVar5 != (void *)0x0) {
        if ((ulong)(lVar11 << 5) < 0x1c00000) {
          alignedFree(pvVar5);
        }
        else {
          os_free(pvVar5,lVar11 << 5,(bool)this[0x28]);
        }
      }
      prims = local_110;
      if (lVar11 != 0) {
        pMVar6 = (local_110->alloc).device;
        (**pMVar6->_vptr_MemoryMonitorInterface)(pMVar6,lVar11 * -0x20,1);
      }
      *(ulong *)(this + 0x30) = numPrimRefs;
      *(ulong *)(this + 0x38) = uVar10;
    }
    sse2::createPrimRefArray
              (&pinfo,*(Scene **)(this + 0x18),MTY_CURVES,false,numPrimRefs,prims,
               &((*(Scene **)(this + 0x18))->progressInterface).super_BuildProgressMonitor);
    uVar9 = pinfo.end - pinfo.begin;
    uVar10 = (ulong)((uint)uVar9 & 3);
    lVar11 = uVar10 * 0x19 + 0x16;
    if (uVar10 == 0) {
      lVar11 = 0;
    }
    FastAllocator::init_estimate
              ((FastAllocator *)(*(long *)(this + 0x10) + 0x78),
               (uVar9 >> 2) * 0x7a + (uVar9 * 0xe0 >> 4) + lVar11);
    *(undefined8 *)(this + 0x48) = 4;
    *(undefined8 *)(this + 0x50) = 0x28;
    for (lVar11 = 0; (4UL >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
    }
    *(long *)(this + 0x58) = lVar11;
    *(undefined8 *)(this + 0x60) = 4;
    *(undefined8 *)(this + 0x68) = 4;
    uVar9 = 0xffffffffffffffff;
    if (999999 < numPrimRefs) {
      uVar9 = numPrimRefs / 1000;
    }
    *(ulong *)(this + 0x70) = uVar9;
    local_78._0_8_ = *(long *)(this + 0x10) + 0x78;
    reportFinishedRange.this =
         (BVHNHairBuilderSAH<4,_embree::CurveNv<4>,_embree::LineMi<4>,_embree::PointMi<4>_> *)this;
    createLeaf.this =
         (BVHNHairBuilderSAH<4,_embree::CurveNv<4>,_embree::LineMi<4>,_embree::PointMi<4>_> *)this;
    root = BVHBuilderHair::
           build<embree::NodeRefPtr<4>,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Set,embree::OBBNode_t<embree::NodeRefPtr<4>,4>::Create,embree::OBBNode_t<embree::NodeRefPtr<4>,4>::Set,embree::sse2::BVHNHairBuilderSAH<4,embree::CurveNi<4>,embree::LineMi<4>,embree::PointMi<4>>::build()::_lambda(embree::PrimRef_const*,embree::range<unsigned_long>const&,embree::FastAllocator::CachedAllocator_const&)_1_,embree::Scene::BuildProgressMonitorInterface,embree::sse2::BVHNHairBuilderSAH<4,embree::CurveNi<4>,embree::LineMi<4>,embree::PointMi<4>>::build()::_lambda(embree::range<unsigned_long>const&)_1_>
                     ((CreateAlloc *)&local_78.field_1,&local_111,&local_112,&local_113,&local_114,
                      &createLeaf,&(*(Scene **)(this + 0x18))->progressInterface,
                      &reportFinishedRange,*(Scene **)(this + 0x18),*(PrimRef **)(this + 0x40),
                      &pinfo,*local_108);
    local_78._0_8_ =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_;
    local_78._8_8_ =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_;
    local_68 = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_;
    uStack_60 = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_;
    local_58 = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_;
    uStack_50 = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_;
    local_48 = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_;
    uStack_40 = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_;
    BVHN<4>::set(*(BVHN<4> **)(this + 0x10),(NodeRef)root.ptr,(LBBox3fa *)&local_78.field_1,
                 pinfo.end - pinfo.begin);
    if (*(long *)(this + 0x70) != -1) {
      root.ptr = (size_t)prims;
      FastAllocator::share((FastAllocator *)(*(long *)(this + 0x10) + 0x78),prims);
    }
    if ((*(byte *)(*(long *)(this + 0x18) + 0x238) & 1) == 0) {
      lVar11 = *(long *)(this + 0x38);
      pvVar5 = *(void **)(this + 0x40);
      if (pvVar5 != (void *)0x0) {
        root.ptr = lVar11 << 5;
        if (root.ptr < (mvector<PrimRef> *)0x1c00000) {
          alignedFree(pvVar5);
        }
        else {
          os_free(pvVar5,root.ptr,(bool)this[0x28]);
        }
      }
      if (lVar11 != 0) {
        pMVar6 = (prims->alloc).device;
        root.ptr = lVar11 * -0x20;
        (**pMVar6->_vptr_MemoryMonitorInterface)(pMVar6,root.ptr,1);
      }
      *(ulong *)pBVar1 = 0;
      *(undefined8 *)(this + 0x38) = 0;
      *(undefined8 *)(this + 0x40) = 0;
    }
    BVHN<4>::cleanup(*(BVHN<4> **)(this + 0x10),(EVP_PKEY_CTX *)root.ptr);
    BVHN<4>::postBuild(*(BVHN<4> **)(this + 0x10),local_100);
  }
  return;
}

Assistant:

void build() 
      {
        /* if we use the primrefarray for allocations we have to take it back from the BVH */
        if (settings.finished_range_threshold != size_t(inf))
          bvh->alloc.unshare(prims);

        /* fast path for empty BVH */
        const size_t numPrimitives = scene->getNumPrimitives(Geometry::MTY_CURVES,false);
        if (numPrimitives == 0) {
          bvh->clear();
          prims.clear();
          return;
        }

        double t0 = bvh->preBuild(TOSTRING(isa) "::BVH" + toString(N) + "HairBuilderSAH");

        /* create primref array */
        prims.resize(numPrimitives);
        const PrimInfo pinfo = createPrimRefArray(scene,Geometry::MTY_CURVES,false,numPrimitives,prims,scene->progressInterface);

        /* estimate acceleration structure size */
        const size_t node_bytes = pinfo.size()*sizeof(typename BVH::OBBNode)/(4*N);
        const size_t leaf_bytes = CurvePrimitive::bytes(pinfo.size());
        bvh->alloc.init_estimate(node_bytes+leaf_bytes);
        
        /* builder settings */
        settings.branchingFactor = N;
        settings.maxDepth = BVH::maxBuildDepthLeaf;
        settings.logBlockSize = bsf(CurvePrimitive::max_size());
        settings.minLeafSize = CurvePrimitive::max_size();
        settings.maxLeafSize = CurvePrimitive::max_size();
        settings.finished_range_threshold = numPrimitives/1000;
        if (settings.finished_range_threshold < 1000)
          settings.finished_range_threshold = inf;

        /* creates a leaf node */
        auto createLeaf = [&] (const PrimRef* prims, const range<size_t>& set, const FastAllocator::CachedAllocator& alloc) -> NodeRef {
          
          if (set.size() == 0)
            return BVH::emptyNode;

          const unsigned int geomID0 = prims[set.begin()].geomID();
          if (scene->get(geomID0)->getTypeMask() & Geometry::MTY_POINTS)
            return PointPrimitive::createLeaf(bvh,prims,set,alloc);
          else if (scene->get(geomID0)->getCurveBasis() == Geometry::GTY_BASIS_LINEAR)
            return LinePrimitive::createLeaf(bvh,prims,set,alloc);
          else
            return CurvePrimitive::createLeaf(bvh,prims,set,alloc);
        };
        
        auto reportFinishedRange = [&] (const range<size_t>& range) -> void
          {
            PrimRef* begin = prims.data()+range.begin();
            PrimRef* end   = prims.data()+range.end(); // FIXME: extended end for spatial split builder!!!!!
            size_t bytes = (size_t)end - (size_t)begin;
            bvh->alloc.addBlock(begin,bytes);
          };
          
        /* build hierarchy */
        typename BVH::NodeRef root = BVHBuilderHair::build<NodeRef>
          (typename BVH::CreateAlloc(bvh),
           typename BVH::AABBNode::Create(),
           typename BVH::AABBNode::Set(),
           typename BVH::OBBNode::Create(),
           typename BVH::OBBNode::Set(),
           createLeaf,scene->progressInterface,
           reportFinishedRange,
           scene,prims.data(),pinfo,settings);
        
        bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
        
        /* if we allocated using the primrefarray we have to keep it alive */
        if (settings.finished_range_threshold != size_t(inf))
          bvh->alloc.share(prims);
        
        /* clear temporary data for static geometry */
        if (scene->isStaticAccel()) {
          prims.clear();
        }
        bvh->cleanup();
        bvh->postBuild(t0);
      }